

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint getNumColorChannels(LodePNGColorType colortype)

{
  undefined4 local_c;
  LodePNGColorType colortype_local;
  
  if (colortype == LCT_GREY) {
    local_c = 1;
  }
  else if (colortype == LCT_RGB) {
    local_c = 3;
  }
  else if (colortype == LCT_PALETTE) {
    local_c = 1;
  }
  else if (colortype == LCT_GREY_ALPHA) {
    local_c = 2;
  }
  else if (colortype == LCT_RGBA) {
    local_c = 4;
  }
  else if (colortype == LCT_MAX_OCTET_VALUE) {
    local_c = 0;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static unsigned getNumColorChannels(LodePNGColorType colortype) {
  switch(colortype) {
    case LCT_GREY: return 1;
    case LCT_RGB: return 3;
    case LCT_PALETTE: return 1;
    case LCT_GREY_ALPHA: return 2;
    case LCT_RGBA: return 4;
    case LCT_MAX_OCTET_VALUE: return 0; /* invalid color type */
    default: return 0; /*invalid color type*/
  }
}